

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O2

size_t json_dumpb(json_t *json,char *buffer,size_t size,size_t flags)

{
  int iVar1;
  buffer buf;
  size_t local_18;
  size_t local_10;
  char *local_8;
  
  local_10 = 0;
  local_18 = size;
  local_8 = buffer;
  iVar1 = json_dump_callback(json,dump_to_buffer,&local_18,flags);
  if (iVar1 != 0) {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

size_t json_dumpb(const json_t *json, char *buffer, size_t size, size_t flags)
{
	struct buffer buf = { size, 0, buffer };

	if (json_dump_callback(json, dump_to_buffer, (void *)&buf, flags))
		return 0;

	return buf.used;
}